

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcryptohash-sha3.c
# Opt level: O3

void p_crypto_hash_sha3_update(PHashSHA3 *ctx,puchar *data,psize len)

{
  uint uVar1;
  ulong __n;
  ulong uVar2;
  ulong __n_00;
  uint uVar3;
  
  uVar1 = ctx->len;
  uVar2 = (ulong)uVar1;
  __n = (ulong)ctx->block_size;
  ctx->len = (puint32)((uVar2 + len) % __n);
  uVar3 = 0;
  if (uVar2 != 0) {
    __n_00 = (ulong)(ctx->block_size - uVar1);
    uVar3 = uVar1;
    if (__n_00 <= len) {
      memcpy((void *)((long)&ctx->buf + uVar2),data,__n_00);
      pp_crypto_hash_sha3_process(ctx,(puint64 *)ctx);
      data = data + __n_00;
      __n = (ulong)ctx->block_size;
      len = len - __n_00;
      uVar3 = 0;
    }
  }
  for (; __n <= len; len = len - __n) {
    memcpy(ctx,data,__n);
    pp_crypto_hash_sha3_process(ctx,(puint64 *)ctx);
    __n = (ulong)ctx->block_size;
    data = data + __n;
  }
  if (len == 0) {
    return;
  }
  memcpy((void *)((long)&ctx->buf + (ulong)uVar3),data,len);
  return;
}

Assistant:

void
p_crypto_hash_sha3_update (PHashSHA3	*ctx,
			   const puchar	*data,
			   psize	len)
{
	puint32	left;
	puint32 to_fill;

	left     = ctx->len;
	to_fill  = ctx->block_size - left;
	ctx->len = (puint32) (((psize) ctx->len + len) % (psize) ctx->block_size);

	if (left && (puint64) len >= to_fill) {
		memcpy (ctx->buf.buf + left, data, to_fill);
		pp_crypto_hash_sha3_swap_bytes (ctx->buf.buf_w, ctx->block_size >> 3);
		pp_crypto_hash_sha3_process (ctx, ctx->buf.buf_w);

		data += to_fill;
		len -= to_fill;
		left = 0;
	}

	while (len >= ctx->block_size) {
		memcpy (ctx->buf.buf, data, ctx->block_size);
		pp_crypto_hash_sha3_swap_bytes (ctx->buf.buf_w, ctx->block_size >> 3);
		pp_crypto_hash_sha3_process (ctx, ctx->buf.buf_w);

		data += ctx->block_size;
		len -= ctx->block_size;
	}

	if (len > 0)
		memcpy (ctx->buf.buf + left, data, len);
}